

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

CharacterNode * __thiscall
icu_63::TextTrieMap::getChildNode(TextTrieMap *this,CharacterNode *parent,UChar c)

{
  CharacterNode *pCVar1;
  UChar UVar2;
  CharacterNode *in_RAX;
  CharacterNode *pCVar3;
  ushort uVar4;
  int iVar5;
  
  uVar4 = parent->fFirstChild;
  do {
    if (uVar4 == 0) goto LAB_001fc60c;
    pCVar1 = this->fNodes + uVar4;
    iVar5 = 1;
    UVar2 = this->fNodes[uVar4].fCharacter;
    pCVar3 = pCVar1;
    if ((UVar2 != c) && (iVar5 = 3, pCVar3 = in_RAX, (ushort)UVar2 <= (ushort)c)) {
      uVar4 = pCVar1->fNextSibling;
      iVar5 = 0;
    }
    in_RAX = pCVar3;
  } while (iVar5 == 0);
  if (iVar5 == 3) {
LAB_001fc60c:
    pCVar3 = (CharacterNode *)0x0;
  }
  return pCVar3;
}

Assistant:

CharacterNode*
TextTrieMap::getChildNode(CharacterNode *parent, UChar c) const {
    // Linear search of the sorted list of children.
    uint16_t nodeIndex = parent->fFirstChild;
    while (nodeIndex > 0) {
        CharacterNode *current = fNodes + nodeIndex;
        UChar childCharacter = current->fCharacter;
        if (childCharacter == c) {
            return current;
        } else if (childCharacter > c) {
            break;
        }
        nodeIndex = current->fNextSibling;
    }
    return NULL;
}